

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testanimators.cpp
# Opt level: O0

void start_button_anims_proc(Am_Object *command_obj)

{
  Am_Value *pAVar1;
  ostream *poVar2;
  void *pvVar3;
  Am_Object local_78;
  uint local_6c;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  int local_38;
  int val;
  Am_Object local_28;
  undefined1 local_20 [8];
  Am_Object_Method method;
  Am_Object *command_obj_local;
  
  method.Call = (Am_Object_Method_Type *)command_obj;
  pAVar1 = (Am_Value *)Am_Object::Get(0x32e0,0xca);
  Am_Object_Method::Am_Object_Method((Am_Object_Method *)local_20,pAVar1);
  Am_Object::Am_Object(&local_28,command_obj);
  (*(code *)method.from_wrapper)(&local_28);
  Am_Object::~Am_Object(&local_28);
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)command_obj,0x169);
  local_38 = Am_Value::operator_cast_to_int(pAVar1);
  if (local_38 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Turning OFF animations of ");
    poVar2 = (ostream *)operator<<(poVar2,&animated_button_color);
    poVar2 = std::operator<<(poVar2," and ");
    pvVar3 = (void *)operator<<(poVar2,&animated_button_bounce);
    pvVar3 = (void *)std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar3,std::flush<char,std::char_traits<char>>);
    Am_Object::Am_Object(&local_40,&animated_button_color);
    Am_Abort_Animator((Am_Object_Data *)&local_40);
    Am_Object::~Am_Object(&local_40);
    Am_Object::Am_Object(&local_48,&animated_button_bounce);
    Am_Abort_Interactor((Am_Object_Data *)&local_48,true);
    Am_Object::~Am_Object(&local_48);
  }
  else if (local_38 == 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Turning on animations of ");
    pvVar3 = (void *)operator<<(poVar2,&animated_button_color);
    pvVar3 = (void *)std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar3,std::flush<char,std::char_traits<char>>);
    Am_Object::Am_Object(&local_50,command_obj);
    next_button_color_proc(&local_50);
    Am_Object::~Am_Object(&local_50);
  }
  else if (local_38 == 2) {
    Am_Object::Am_Object(&local_58,&animated_button_color);
    Am_Abort_Animator((Am_Object_Data *)&local_58);
    Am_Object::~Am_Object(&local_58);
    poVar2 = std::operator<<((ostream *)&std::cout,"Turning on animations of ");
    pvVar3 = (void *)operator<<(poVar2,&animated_button_bounce);
    pvVar3 = (void *)std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar3,std::flush<char,std::char_traits<char>>);
    Am_Object::Set(0x2520,true,1);
    Am_Object::Am_Object(&local_60,&animated_button_bounce);
    Am_Object::Am_Object(&local_68,(Am_Object *)&Am_No_Object);
    local_6c = _Am_Default_Start_Char;
    Am_Object::Am_Object(&local_78,(Am_Object *)&Am_No_Object);
    Am_Start_Interactor((Am_Object_Data *)&local_60,(Am_Object_Data *)&local_68,
                        (Am_Input_Char *)(ulong)local_6c,(Am_Object_Data *)&local_78,0,0,true);
    Am_Object::~Am_Object(&local_78);
    Am_Object::~Am_Object(&local_68);
    Am_Object::~Am_Object(&local_60);
  }
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, start_button_anims,
                 (Am_Object command_obj))
{
  //first, call the standard do
  Am_Object_Method method = Am_Cycle_Value_Command.Get(Am_DO_METHOD);
  method.Call(command_obj);
  //now see if need to start an animation
  int val = command_obj.Get(Am_VALUE);
  if (val == 0) { //just hit stop
    std::cout << "Turning OFF animations of " << animated_button_color
              << " and " << animated_button_bounce << std::endl
              << std::flush;
    Am_Abort_Animator(animated_button_color);
    Am_Abort_Interactor(animated_button_bounce);
  } else if (val == 1) { //just hit color
    std::cout << "Turning on animations of " << animated_button_color
              << std::endl
              << std::flush;
    next_button_color_proc(command_obj);
  } else if (val == 2) { //just hit position
    Am_Abort_Animator(animated_button_color);
    std::cout << "Turning on animations of " << animated_button_bounce
              << std::endl
              << std::flush;
    animated_button_bounce.Set(Am_ACTIVE, true);
    Am_Start_Interactor(animated_button_bounce);
  }
}